

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_checkpointer.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnDataCheckpointer::WritePersistentSegments
          (ColumnDataCheckpointer *this,ColumnCheckpointState *state)

{
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> this_00;
  reference pvVar1;
  pointer this_01;
  ulong __n;
  vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true> nodes;
  DataPointer pointer;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> local_e0;
  vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
  local_d8;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> *local_c0;
  DataPointer local_b8;
  
  SegmentTree<duckdb::ColumnSegment,_false>::MoveSegments
            ((vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true> *)&local_d8,
             &(state->column_data->data).super_SegmentTree<duckdb::ColumnSegment,_false>);
  local_c0 = &state->global_stats;
  for (__n = 0; __n < (ulong)((long)local_d8.
                                    super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_d8.
                                    super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4); __n = __n + 1)
  {
    pvVar1 = vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::get<true>
                       ((vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true> *)&local_d8,__n);
    this_00._M_head_impl =
         (pvVar1->node).
         super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
         super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
         .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
    ColumnSegment::GetDataPointer(&local_b8,this_00._M_head_impl);
    this_01 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              ::operator->(local_c0);
    BaseStatistics::Merge(this_01,&((this_00._M_head_impl)->stats).statistics);
    pvVar1 = vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::get<true>
                       ((vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true> *)&local_d8,__n);
    local_e0._M_head_impl =
         (pvVar1->node).
         super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
         super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
         .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
    (pvVar1->node).
    super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
    super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
    super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
    SegmentTree<duckdb::ColumnSegment,_false>::AppendSegment
              (&(state->new_tree).super_SegmentTree<duckdb::ColumnSegment,_false>,
               (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                *)&local_e0);
    ::std::unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::
    ~unique_ptr((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
                &local_e0);
    ::std::vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>::
    emplace_back<duckdb::DataPointer>
              (&(state->data_pointers).
                super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>,&local_b8);
    DataPointer::~DataPointer(&local_b8);
  }
  ::std::
  vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
  ::~vector(&local_d8);
  return;
}

Assistant:

void ColumnDataCheckpointer::WritePersistentSegments(ColumnCheckpointState &state) {
	// all segments are persistent and there are no updates
	// we only need to write the metadata

	auto &col_data = state.column_data;
	auto nodes = col_data.data.MoveSegments();

	for (idx_t segment_idx = 0; segment_idx < nodes.size(); segment_idx++) {
		auto segment = nodes[segment_idx].node.get();
		auto pointer = segment->GetDataPointer();

		// merge the persistent stats into the global column stats
		state.global_stats->Merge(segment->stats.statistics);

		// directly append the current segment to the new tree
		state.new_tree.AppendSegment(std::move(nodes[segment_idx].node));

		state.data_pointers.push_back(std::move(pointer));
	}
}